

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

WirehairResult __thiscall
wirehair::Codec::ChooseMatrix(Codec *this,uint64_t message_bytes,uint block_bytes)

{
  ushort uVar1;
  uint16_t uVar2;
  WirehairResult WVar3;
  
  WVar3 = Wirehair_InvalidInput;
  if (block_bytes != 0 && message_bytes != 0) {
    this->_block_bytes = block_bytes;
    uVar2 = (uint16_t)(((message_bytes - 1) + (ulong)block_bytes) / (ulong)block_bytes);
    this->_block_count = uVar2;
    uVar2 = NextPrime16(uVar2);
    this->_block_next_prime = uVar2;
    uVar1 = this->_block_count;
    WVar3 = Wirehair_BadInput_SmallN;
    if ((1 < uVar1) && (WVar3 = Wirehair_BadInput_LargeN, uVar1 < 0xfa01)) {
      if (this->_seed_override == false) {
        uVar2 = GetDenseCount((uint)uVar1);
        this->_dense_count = uVar2;
        uVar2 = GetDenseSeed((uint)this->_block_count,(uint)uVar2);
        this->_d_seed = (uint)uVar2;
        uVar2 = GetPeelSeed((uint)this->_block_count);
        this->_p_seed = (uint)uVar2;
      }
      uVar2 = this->_dense_count + 6;
      this->_mix_count = uVar2;
      uVar2 = NextPrime16(uVar2);
      this->_mix_next_prime = uVar2;
      this->_peel_head_rows = 0xffff;
      this->_peel_tail_rows = (PeelRow *)0x0;
      this->_defer_head_rows = 0xffff;
      WVar3 = Wirehair_Success;
    }
  }
  return WVar3;
}

Assistant:

WirehairResult Codec::ChooseMatrix(
    uint64_t message_bytes,
    unsigned block_bytes)
{
    CAT_IF_DUMP(cout << endl << "---- ChooseMatrix ----" << endl << endl;)

    // Validate input
    if (message_bytes < 1 || block_bytes < 1) {
        return Wirehair_InvalidInput;
    }

    // Calculate message block count
    _block_bytes = block_bytes;
    _block_count = static_cast<uint16_t>((message_bytes + _block_bytes - 1) / _block_bytes);
    _block_next_prime = NextPrime16(_block_count);

    // Validate block count
    if (_block_count < CAT_WIREHAIR_MIN_N) {
        return Wirehair_BadInput_SmallN;
    }
    if (_block_count > CAT_WIREHAIR_MAX_N) {
        return Wirehair_BadInput_LargeN;
    }

    CAT_IF_DUMP(cout << "Total message = " << message_bytes << " bytes.  Block bytes = " << _block_bytes << endl;)
    CAT_IF_DUMP(cout << "Block count = " << _block_count << " +Prime=" << _block_next_prime << endl;)

    if (!_seed_override)
    {
        // Pick dense row count, dense row seed, and peel row seed
        _dense_count = GetDenseCount(_block_count);
        _d_seed = GetDenseSeed(_block_count, _dense_count);
        _p_seed = GetPeelSeed(_block_count);
    }

    CAT_IF_DUMP(cout << "Peel seed = " << _p_seed << "  Dense seed = " << _d_seed << endl;)

    _mix_count = _dense_count + kHeavyRows;
    _mix_next_prime = NextPrime16(_mix_count);

    CAT_IF_DUMP(cout << "Mix count = " << _mix_count << " +Prime=" << _mix_next_prime << endl;)

    // Initialize lists
    _peel_head_rows = LIST_TERM;
    _peel_tail_rows = 0;
    _defer_head_rows = LIST_TERM;

    return Wirehair_Success;
}